

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compactor.cc
# Opt level: O2

void compactor_get_next_filename(char *file,char *nextfile)

{
  char *__s;
  long lVar1;
  bool bVar2;
  uint uVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  ulong __n;
  int local_4c;
  char str_no [24];
  
  local_4c = 0;
  uVar3 = _compactor_prefix_len(file);
  if (0 < (int)uVar3) {
    __n = (ulong)uVar3;
    __s = file + __n;
    sVar4 = strlen(__s);
    uVar5 = 0;
    if (0 < (int)sVar4) {
      uVar5 = sVar4 & 0xffffffff;
    }
    uVar6 = 0xffffffffffffffff;
    do {
      uVar7 = uVar5;
      if (uVar6 - uVar5 == -1) break;
      lVar1 = uVar6 + 1;
      uVar7 = uVar6 + 1;
      uVar6 = uVar7;
    } while (0xf5 < (byte)(__s[lVar1] - 0x3aU));
    if ((long)(int)sVar4 <= (long)uVar7) {
      __isoc99_sscanf(__s,"%d",&local_4c);
      strncpy(nextfile,file,__n);
      do {
        nextfile[__n] = '\0';
        local_4c = local_4c + 1;
        sprintf(str_no,"%d");
        strcat(nextfile,str_no);
        bVar2 = does_file_exist(nextfile);
      } while (bVar2);
      return;
    }
  }
  iVar8 = 1;
  do {
    strcpy(nextfile,file);
    sprintf(str_no,".%d",iVar8);
    strcat(nextfile,str_no);
    bVar2 = does_file_exist(nextfile);
    iVar8 = iVar8 + 1;
  } while (bVar2);
  return;
}

Assistant:

void compactor_get_next_filename(char *file, char *nextfile)
{
    int compaction_no = 0;
    int prefix_len = _compactor_prefix_len(file);
    char str_no[24];

    if (prefix_len > 0 && _allDigit(file + prefix_len)) {
        sscanf(file+prefix_len, "%d", &compaction_no);
        strncpy(nextfile, file, prefix_len);
        do {
            nextfile[prefix_len] = 0;
            sprintf(str_no, "%d", ++compaction_no);
            strcat(nextfile, str_no);
        } while (does_file_exist(nextfile));
    } else {
        do {
            strcpy(nextfile, file);
            sprintf(str_no, ".%d", ++compaction_no);
            strcat(nextfile, str_no);
        } while (does_file_exist(nextfile));
    }
}